

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error IsMacResource(FT_Library library,FT_Stream stream,FT_Long resource_offset,
                      FT_Long face_index,FT_Face *aface)

{
  ulong uVar1;
  ushort uVar2;
  FT_UInt16 FVar3;
  FT_Error FVar4;
  FT_UInt32 FVar5;
  int iVar6;
  unsigned_long uVar7;
  FT_Byte *pFVar8;
  int *buffer;
  FT_ULong count_00;
  ulong uVar9;
  FT_Memory pFVar10;
  FT_Parameter *params;
  char *driver_name;
  FT_Face *aface_00;
  ulong uVar11;
  FT_Error local_ac;
  long local_a8;
  FT_Byte *local_a0;
  FT_Library local_98;
  FT_Memory local_90;
  FT_ULong local_88;
  ulong local_80;
  FT_Memory local_78;
  uint local_6c;
  ulong local_68;
  FT_Face *local_60;
  FT_Memory local_58;
  FT_Long count;
  FT_Long *local_48;
  FT_Long rdata_pos;
  FT_Long map_offset;
  
  pFVar10 = library->memory;
  FVar4 = FT_Raccess_Get_HeaderInfo(library,stream,resource_offset,&map_offset,&rdata_pos);
  if (FVar4 != 0) {
    return FVar4;
  }
  local_60 = aface;
  local_58 = pFVar10;
  FVar4 = FT_Raccess_Get_DataOffsets
                    (library,stream,map_offset,rdata_pos,0x504f5354,'\x01',&local_48,&count);
  local_98 = library;
  if (FVar4 != 0) {
    params = (FT_Parameter *)0x73666e74;
    aface_00 = (FT_Face *)0x0;
    FVar4 = FT_Raccess_Get_DataOffsets
                      (library,stream,map_offset,rdata_pos,0x73666e74,'\0',&local_48,&count);
    if (FVar4 != 0) {
      return FVar4;
    }
    uVar9 = face_index % count >> 0x3f ^ face_index % count;
    if ((long)uVar9 < count) {
      local_90 = library->memory;
      uVar11 = local_48[uVar9];
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        iVar6 = 0x55;
        if (uVar11 <= stream->size) goto LAB_002199e7;
      }
      else {
        uVar7 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
        iVar6 = 0x55;
        if (uVar7 == 0) {
LAB_002199e7:
          stream->pos = uVar11;
          local_ac = 0;
          FVar5 = FT_Stream_ReadULong(stream,&local_ac);
          iVar6 = local_ac;
          if (local_ac == 0) {
            if ((FT_Memory)(ulong)FVar5 == (FT_Memory)0x0) {
              iVar6 = 1;
            }
            else {
              iVar6 = 9;
              if (FVar5 < 0x1000000) {
                local_78 = (FT_Memory)(ulong)FVar5;
                FVar4 = open_face_PS_from_sfnt_stream
                                  (local_98,stream,uVar9,(FT_Int)local_60,params,aface_00);
                if (FVar4 == 0) {
                  iVar6 = 0;
                }
                else {
                  uVar11 = uVar11 + 4;
                  if (stream->read == (FT_Stream_IoFunc)0x0) {
                    iVar6 = 0x55;
                    if (uVar11 <= stream->size) goto LAB_00219b74;
                  }
                  else {
                    uVar7 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
                    iVar6 = 0x55;
                    if (uVar7 == 0) {
LAB_00219b74:
                      pFVar10 = local_78;
                      stream->pos = uVar11;
                      buffer = (int *)(*local_90->alloc)(local_90,(long)local_78);
                      if (buffer == (int *)0x0) {
                        iVar6 = 0x40;
                      }
                      else {
                        iVar6 = FT_Stream_Read(stream,(FT_Byte *)buffer,(FT_ULong)pFVar10);
                        if (iVar6 == 0) {
                          if ((uint)pFVar10 < 5) {
                            driver_name = "truetype";
                          }
                          else {
                            driver_name = "truetype";
                            if (*buffer == 0x4f54544f) {
                              driver_name = "cff";
                            }
                          }
                          iVar6 = open_face_from_buffer
                                            (local_98,(FT_Byte *)buffer,(FT_ULong)pFVar10,0,
                                             driver_name,local_60);
                        }
                        else {
                          (*local_90->free)(local_90,buffer);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar6 = 1;
      if (local_48 == (FT_Long *)0x0) {
        return 1;
      }
    }
    (*local_58->free)(local_58,local_48);
    if (iVar6 != 0) {
      return iVar6;
    }
    goto LAB_00219abb;
  }
  FVar4 = 1;
  if (face_index + 1U < 2) {
    local_90 = (FT_Memory)count;
    if (count < 1) {
      FVar4 = 10;
      goto LAB_002199c8;
    }
    local_78 = library->memory;
    pFVar10 = (FT_Memory)0x0;
    uVar9 = 0;
    do {
      uVar11 = local_48[(long)pFVar10];
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        if (stream->size < uVar11) goto LAB_00219a22;
      }
      else {
        uVar7 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
        if (uVar7 != 0) {
LAB_00219a22:
          FVar4 = 0x55;
          goto LAB_00219aa7;
        }
      }
      stream->pos = uVar11;
      local_ac = 0;
      FVar5 = FT_Stream_ReadULong(stream,&local_ac);
      FVar4 = local_ac;
      if (local_ac != 0) goto LAB_00219aa7;
      FVar4 = 9;
      if ((0xffffff < FVar5) || (0xffffff - (ulong)FVar5 < uVar9 + 6)) goto LAB_00219aa7;
      uVar9 = uVar9 + 6 + (ulong)FVar5;
      pFVar10 = (FT_Memory)((long)&pFVar10->user + 1);
    } while (local_90 != pFVar10);
    local_68 = uVar9 + 2;
    pFVar8 = (FT_Byte *)(*local_78->alloc)(local_78,local_68);
    if (pFVar8 != (FT_Byte *)0x0) {
      pFVar8[0] = 0x80;
      pFVar8[1] = '\x01';
      pFVar8[2] = '\0';
      pFVar8[3] = '\0';
      pFVar8[4] = '\0';
      pFVar8[5] = '\0';
      local_a0 = pFVar8;
      if ((long)local_90 < 1) {
        local_88 = 0;
        local_a8 = 2;
        uVar11 = 6;
      }
      else {
        local_6c = 1;
        uVar11 = 6;
        local_a8 = 2;
        pFVar10 = (FT_Memory)0x0;
        local_88 = 0;
        do {
          uVar1 = local_48[(long)pFVar10];
          local_80 = uVar11;
          if (stream->read == (FT_Stream_IoFunc)0x0) {
            if (stream->size < uVar1) goto LAB_00219b15;
          }
          else {
            uVar7 = (*stream->read)(stream,uVar1,(uchar *)0x0,0);
            if (uVar7 != 0) goto LAB_00219b15;
          }
          stream->pos = uVar1;
          local_ac = 0;
          FVar5 = FT_Stream_ReadULong(stream,&local_ac);
          if (((local_ac != 0) || ((int)FVar5 < 0)) ||
             (FVar3 = FT_Stream_ReadUShort(stream,&local_ac), local_ac != 0)) goto LAB_00219b15;
          local_ac = 10;
          uVar11 = local_80;
          if (0xff < FVar3) {
            uVar2 = FVar3 >> 8;
            count_00 = (ulong)FVar5 - 2;
            if (FVar5 < 3) {
              count_00 = 0;
            }
            if (local_6c == uVar2) {
              local_88 = local_88 + count_00;
            }
            else {
              if (local_68 < local_a8 + 3U) goto LAB_00219b15;
              *(int *)(local_a0 + local_a8) = (int)local_88;
              if (uVar2 == 5) break;
              uVar11 = local_80 + 6;
              if (local_68 < uVar11) goto LAB_00219b15;
              local_a0[local_80] = 0x80;
              local_a8 = local_80 + 2;
              local_a0[local_80 + 1] = (FT_Byte)(FVar3 >> 8);
              pFVar8 = local_a0 + local_80 + 2;
              pFVar8[0] = '\0';
              pFVar8[1] = '\0';
              pFVar8[2] = '\0';
              pFVar8[3] = '\0';
              local_6c = (uint)uVar2;
              local_88 = count_00;
            }
            if (((uVar9 < uVar11) || (uVar9 < uVar11 + count_00)) ||
               (local_ac = FT_Stream_Read(stream,local_a0 + uVar11,count_00),
               uVar11 = uVar11 + count_00, local_ac != 0)) goto LAB_00219b15;
          }
          pFVar10 = (FT_Memory)((long)&pFVar10->user + 1);
        } while (local_90 != pFVar10);
      }
      if ((local_68 < uVar11 + 2) ||
         ((local_a0 + uVar11)[0] = 0x80, (local_a0 + uVar11)[1] = '\x03', local_68 < local_a8 + 3U))
      {
LAB_00219b15:
        (*local_78->free)(local_78,local_a0);
        FVar4 = 1;
      }
      else {
        *(int *)(local_a0 + local_a8) = (int)local_88;
        FVar4 = open_face_from_buffer(local_98,local_a0,uVar11 + 2,0,"type1",local_60);
      }
      goto LAB_002199c8;
    }
    FVar4 = 0x40;
LAB_00219aa7:
    (*local_58->free)(local_58,local_48);
  }
  else {
LAB_002199c8:
    if (local_48 != (FT_Long *)0x0) goto LAB_00219aa7;
  }
  if (FVar4 != 0) {
    return FVar4;
  }
  count = 1;
LAB_00219abb:
  (*local_60)->num_faces = count;
  return 0;
}

Assistant:

static FT_Error
  IsMacResource( FT_Library  library,
                 FT_Stream   stream,
                 FT_Long     resource_offset,
                 FT_Long     face_index,
                 FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Error   error;
    FT_Long    map_offset, rdata_pos;
    FT_Long    *data_offsets;
    FT_Long    count;


    error = FT_Raccess_Get_HeaderInfo( library, stream, resource_offset,
                                       &map_offset, &rdata_pos );
    if ( error )
      return error;

    /* POST resources must be sorted to concatenate properly */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_POST, TRUE,
                                        &data_offsets, &count );
    if ( !error )
    {
      error = Mac_Read_POST_Resource( library, stream, data_offsets, count,
                                      face_index, aface );
      FT_FREE( data_offsets );
      /* POST exists in an LWFN providing a single face */
      if ( !error )
        (*aface)->num_faces = 1;
      return error;
    }

    /* sfnt resources should not be sorted to preserve the face order by
       QuickDraw API */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_sfnt, FALSE,
                                        &data_offsets, &count );
    if ( !error )
    {
      FT_Long  face_index_internal = face_index % count;


      error = Mac_Read_sfnt_Resource( library, stream, data_offsets, count,
                                      face_index_internal, aface );
      FT_FREE( data_offsets );
      if ( !error )
        (*aface)->num_faces = count;
    }

    return error;
  }